

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

bool __thiscall
fasttext::FastText::predictLine
          (FastText *this,istream *in,
          vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *predictions)

{
  pointer ppVar1;
  int iVar2;
  pointer ppVar3;
  Predictions linePredictions;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> labels;
  float local_ac;
  _Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<int,_std::allocator<int>_> local_68;
  string local_50;
  
  std::
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(predictions);
  iVar2 = std::istream::peek();
  if (iVar2 != -1) {
    local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Dictionary::getLine((this->dict_).
                        super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        in,(vector<int,_std::allocator<int>_> *)&local_88,
                        (vector<int,_std::allocator<int>_> *)&local_68);
    local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    predict(this,(vector<int,_std::allocator<int>_> *)&local_88,(Predictions *)&local_a8);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::reserve(predictions,
              (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 3);
    ppVar1 = local_a8._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = local_a8._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1;
        ppVar3 = ppVar3 + 1) {
      local_ac = expf(ppVar3->first);
      Dictionary::getLabel_abi_cxx11_
                (&local_50,
                 (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,ppVar3->second);
      std::
      vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
      ::emplace_back<float,std::__cxx11::string>
                ((vector<std::pair<float,std::__cxx11::string>,std::allocator<std::pair<float,std::__cxx11::string>>>
                  *)predictions,&local_ac,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::_Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~_Vector_base
              (&local_a8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  }
  return iVar2 != -1;
}

Assistant:

bool FastText::predictLine(std::istream& in, std::vector<std::pair<real, std::string>>& predictions) const {
  predictions.clear();
  if (in.peek() == EOF) {
    return false;
  }

  std::vector<int32_t> words, labels;
  dict_->getLine(in, words, labels);
  Predictions linePredictions;
  predict(words, linePredictions);
  predictions.reserve(linePredictions.size());
  for (const auto& p : linePredictions) {
    predictions.emplace_back(std::exp(p.first), dict_->getLabel(p.second));
  }

  return true;
}